

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> * __thiscall
FillableSigningProvider::GetCScripts
          (set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> *__return_storage_ptr__,
          FillableSigningProvider *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs_KeyStore).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (this->mapScripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->mapScripts)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    std::
    _Rb_tree<CScriptID,CScriptID,std::_Identity<CScriptID>,std::less<CScriptID>,std::allocator<CScriptID>>
    ::_M_insert_unique<CScriptID_const&>
              ((_Rb_tree<CScriptID,CScriptID,std::_Identity<CScriptID>,std::less<CScriptID>,std::allocator<CScriptID>>
                *)__return_storage_ptr__,(CScriptID *)(p_Var2 + 1));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CScriptID> FillableSigningProvider::GetCScripts() const
{
    LOCK(cs_KeyStore);
    std::set<CScriptID> set_script;
    for (const auto& mi : mapScripts) {
        set_script.insert(mi.first);
    }
    return set_script;
}